

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

byte * __thiscall
Memory::LargeHeapBlock::GetRealAddressFromInterior(LargeHeapBlock *this,void *interiorAddress)

{
  LargeObjectHeader *pLVar1;
  LargeObjectHeader *header;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  LargeObjectHeader *local_38;
  
  if (this->allocCount != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar6 = 0;
    do {
      header = (LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar6];
      bVar3 = true;
      if ((header != (LargeObjectHeader *)0x0) &&
         (bVar4 = IsPartialSweptHeader(this,header), !bVar4)) {
        if (uVar6 != header->objectIndex) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x3ca,"(header->objectIndex == i)","header->objectIndex == i");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        pLVar1 = header + 1;
        if ((pLVar1 <= interiorAddress) &&
           (interiorAddress < (void *)((long)&pLVar1->objectIndex + header->objectSize))) {
          bVar3 = false;
          local_38 = pLVar1;
        }
      }
      if (!bVar3) {
        return (byte *)local_38;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->allocCount);
  }
  return (byte *)0x0;
}

Assistant:

byte *
LargeHeapBlock::GetRealAddressFromInterior(void * interiorAddress)
{
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];

#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
        if (header != nullptr && !IsPartialSweptHeader(header))
#else
        if (header != nullptr)
#endif
        {
            Assert(header->objectIndex == i);
            byte * startAddress = (byte *)header->GetAddress();
            if (startAddress <= interiorAddress && (startAddress + header->objectSize > interiorAddress))
            {
                return startAddress;
            }
        }
    }

    return nullptr;
}